

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O2

int Cut_CutListVerify(Cut_Cut_t *pList)

{
  int iVar1;
  Cut_Cut_t *pCut;
  Cut_Cut_t *pDom;
  
  pCut = pList;
  do {
    pDom = pList;
    if (pCut == (Cut_Cut_t *)0x0) {
      return 1;
    }
    for (; pDom != pCut; pDom = pDom->pNext) {
      iVar1 = Cut_CutCheckDominance(pDom,pCut);
      if (iVar1 != 0) {
        puts("******************* These are contained cuts:");
        Cut_CutPrint(pDom,1);
        Cut_CutPrint(pDom,1);
        return 0;
      }
    }
    pCut = pCut->pNext;
  } while( true );
}

Assistant:

int Cut_CutListVerify( Cut_Cut_t * pList )
{ 
    Cut_Cut_t * pCut, * pDom;
    Cut_ListForEachCut( pList, pCut )
    {
        Cut_ListForEachCutStop( pList, pDom, pCut )
        {
            if ( Cut_CutCheckDominance( pDom, pCut ) )
            {
                printf( "******************* These are contained cuts:\n" );
                Cut_CutPrint( pDom, 1 );
                Cut_CutPrint( pDom, 1 );
                return 0;
            }
        }
    }
    return 1;
}